

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O0

PosFilter * indirect_filter(Ray *r,Random *rng,int depth,int maxdepth)

{
  bool bVar1;
  reference this;
  int in_ECX;
  Ray *in_RDX;
  long in_RSI;
  pair<Vector,_Vector> *in_RDI;
  int in_R8D;
  double dVar2;
  Vector *pVVar3;
  double z;
  Vector *this_00;
  PosFilter res;
  Vector f;
  Vector wi;
  Vector wo;
  Vector e;
  double pdf;
  Vector nl;
  Vector n;
  Vector x;
  Material *mat;
  Sphere *obj;
  int id;
  double t;
  Vector *in_stack_fffffffffffffdc8;
  Vector *in_stack_fffffffffffffdd0;
  Ray *in_stack_fffffffffffffdd8;
  Vector *pVVar4;
  vector<Sphere,_std::allocator<Sphere>_> *in_stack_fffffffffffffde0;
  Vector local_1f0;
  Vector *in_stack_fffffffffffffe38;
  Vector *in_stack_fffffffffffffe40;
  Vector *in_stack_fffffffffffffe48;
  Material *in_stack_fffffffffffffe50;
  Vector local_1a8 [4];
  Vector local_148 [2];
  Vector local_118;
  double local_100;
  Vector local_f8;
  Vector local_e0 [2];
  Vector local_b0 [2];
  double *in_stack_ffffffffffffff80;
  Vector *in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  Vector local_58;
  Vector local_40;
  int local_24;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  local_24 = 0;
  bVar1 = Intersect(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                    &in_stack_fffffffffffffdd0->x,(int *)in_stack_fffffffffffffdc8);
  if (bVar1) {
    this = std::vector<Sphere,_std::allocator<Sphere>_>::operator[](&spheres,(long)local_24);
    pVVar4 = &(this->mat).ke;
    operator*(in_stack_fffffffffffffdd0,(double)in_stack_fffffffffffffdc8);
    operator+(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    operator-(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    Vector::Normalize(in_stack_fffffffffffffdd0);
    dVar2 = Vector::Dot(local_b0,(Vector *)(in_RSI + 0x18));
    if (0.0 <= dVar2) {
      operator*(in_stack_fffffffffffffdd0,(double)in_stack_fffffffffffffdc8);
    }
    else {
      local_e0[0].x = local_b0[0].x;
      local_e0[0].y = local_b0[0].y;
      local_e0[0].z = local_b0[0].z;
    }
    if (in_ECX < in_R8D) {
      pVVar3 = (Vector *)Random::operator()((Random *)0x1334d4);
      dVar2 = Random::operator()((Random *)0x1334e7);
      z = Random::operator()((Random *)0x1334f9);
      Vector::Vector(&local_118,(double)pVVar3,dVar2,z);
      operator-(pVVar3);
      Material::Sample((Material *)this,pVVar4,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff80);
      pVVar3 = (Vector *)Vector::Dot(local_148,local_e0);
      Material::Reflectance
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38);
      operator*((double)in_stack_fffffffffffffdd0,pVVar3);
      Ray::Ray((Ray *)&stack0xfffffffffffffe28,(Vector *)&stack0xffffffffffffff80,local_148);
      indirect_filter(in_RDX,(Random *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffe4,
                      in_stack_ffffffffffffffe0);
      pVVar4 = local_1a8;
      this_00 = (Vector *)(1.0 / local_100);
      Vector::Multiply(this_00,pVVar3);
      operator*((double)this_00,pVVar3);
      std::pair<Vector,_Vector>::pair<Vector,_true>(in_RDI,pVVar4,&local_1f0);
    }
    else {
      Vector::Vector(&local_f8,1.0,1.0,1.0);
      std::pair<Vector,_Vector>::pair<Vector_&,_Vector,_true>
                (in_RDI,(Vector *)&stack0xffffffffffffff80,&local_f8);
    }
  }
  else {
    Vector::Vector(&local_40,0.0,0.0,0.0);
    Vector::Vector(&local_58,0.0,0.0,0.0);
    std::pair<Vector,_Vector>::pair<Vector,_Vector,_true>(in_RDI,&local_40,&local_58);
  }
  return in_RDI;
}

Assistant:

PosFilter indirect_filter(const Ray &r, Random& rng, int depth, int maxdepth=2){
   double t;                               // distance to Intersection
   int id=0;                               // id of Intersected object
   if (!Intersect(spheres, r, t, id)) return PosFilter(Vector(), Vector()); // if miss, return black
   const Sphere&   obj = spheres[id];      // the hit object
   const Material& mat = obj.mat;          // Its material
   Vector x  = r.o+r.d*t,
          n  = (x-obj.c).Normalize(),
          nl = Vector::Dot(n,r.d) < 0 ? n:n*-1;

   // Once you reach the max depth, return the hit position and the filter's
   // value using the recursive form.
   if(depth >= maxdepth) {
      return PosFilter(x, Vector(1.0f, 1.0f, 1.0f));

   // Main covariance computation. First this code generate a new direction
   // and query the covariance+radiance in that direction. Then, it computes
   // the covariance after the reflection/refraction.
   } else {
      /* Sampling a new direction + recursive call */
      double pdf;
      const auto e   = Vector(rng(), rng(), rng());
      const auto wo  = -r.d;
      const auto wi  = mat.Sample(wo, nl, e, pdf);
            auto f   = Vector::Dot(wi, nl)*mat.Reflectance(wi, wo, nl);
      const auto res = indirect_filter(Ray(x, wi), rng, depth+1, maxdepth);
      return PosFilter(res.first, (1.f/pdf) * f.Multiply(res.second));
   }
}